

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskFilesystem>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::DiskFilesystem> *this,void *pointer)

{
  long lVar1;
  undefined8 uVar2;
  
  if (pointer != (void *)0x0) {
    lVar1 = *(long *)((long)pointer + 0x28);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)pointer + 0x30);
      *(undefined8 *)((long)pointer + 0x28) = 0;
      *(undefined8 *)((long)pointer + 0x30) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x38))
                (*(undefined8 **)((long)pointer + 0x38),lVar1,0x18,uVar2,uVar2,
                 ArrayDisposer::Dispose_<kj::String,_false>::destruct);
    }
    AutoCloseFd::~AutoCloseFd((AutoCloseFd *)((long)pointer + 0x20));
    AutoCloseFd::~AutoCloseFd((AutoCloseFd *)((long)pointer + 0x10));
  }
  operator_delete(pointer,0x40);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }